

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

void __thiscall despot::util::tinyxml::TiXmlNode::Clear(TiXmlNode *this)

{
  TiXmlBase *pTVar1;
  TiXmlNode *pTVar2;
  
  pTVar2 = this->firstChild;
  while (pTVar2 != (TiXmlNode *)0x0) {
    pTVar1 = &pTVar2->super_TiXmlBase;
    pTVar2 = pTVar2->next;
    (*pTVar1->_vptr_TiXmlBase[1])();
  }
  this->firstChild = (TiXmlNode *)0x0;
  this->lastChild = (TiXmlNode *)0x0;
  return;
}

Assistant:

void TiXmlNode::Clear() {
	TiXmlNode* node = firstChild;
	TiXmlNode* temp = 0;

	while (node) {
		temp = node;
		node = node->next;
		delete temp;
	}

	firstChild = 0;
	lastChild = 0;
}